

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QIcon __thiscall QWidget::windowIcon(QWidget *this)

{
  long lVar1;
  unique_ptr<QIcon,_std::default_delete<QIcon>_> *this_00;
  type pQVar2;
  long in_RSI;
  
  while( true ) {
    if (in_RSI == 0) {
      QGuiApplication::windowIcon();
      return (QIcon)(QIconPrivate *)this;
    }
    lVar1 = *(long *)(*(long *)(in_RSI + 8) + 0x78);
    if (((lVar1 != 0) &&
        (this_00 = *(unique_ptr<QIcon,_std::default_delete<QIcon>_> **)(lVar1 + 8),
        this_00 != (unique_ptr<QIcon,_std::default_delete<QIcon>_> *)0x0)) &&
       ((this_00->_M_t).super___uniq_ptr_impl<QIcon,_std::default_delete<QIcon>_>._M_t.
        super__Tuple_impl<0UL,_QIcon_*,_std::default_delete<QIcon>_>.
        super__Head_base<0UL,_QIcon_*,_false>._M_head_impl != (QIcon *)0x0)) break;
    in_RSI = *(long *)(*(long *)(in_RSI + 8) + 0x10);
  }
  pQVar2 = std::unique_ptr<QIcon,_std::default_delete<QIcon>_>::operator*(this_00);
  QIcon::QIcon((QIcon *)this,pQVar2);
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QWidget::windowIcon() const
{
    const QWidget *w = this;
    while (w) {
        const QWidgetPrivate *d = w->d_func();
        if (d->extra && d->extra->topextra && d->extra->topextra->icon)
            return *d->extra->topextra->icon;
        w = w->parentWidget();
    }
    return QApplication::windowIcon();
}